

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messagebox.cpp
# Opt level: O3

void __thiscall QtMWidgets::MsgBoxTitle::paintEvent(MsgBoxTitle *this,QPaintEvent *param_1)

{
  int iVar1;
  MsgBoxTitlePrivate *pMVar2;
  long lVar3;
  ColorGroup CVar4;
  QPainter p;
  undefined1 local_50 [32];
  QString local_30;
  double dStack_18;
  
  QPainter::QPainter((QPainter *)local_50,(QPaintDevice *)&this->field_0x10);
  CVar4 = QWidget::palette();
  QPalette::brush(CVar4,Dark);
  QPainter::setPen((QColor *)local_50);
  pMVar2 = (this->d).d;
  iVar1 = pMVar2->margin;
  local_30.d.d = (Data *)(double)iVar1;
  lVar3 = *(long *)&this->field_0x20;
  local_30.d.ptr = (char16_t *)0x0;
  local_30.d.size =
       (qsizetype)
       (double)(((int)*(undefined8 *)(lVar3 + 0x1c) - (iVar1 * 2 + *(int *)(lVar3 + 0x14))) + 1);
  dStack_18 = (double)(((int)((ulong)*(undefined8 *)(lVar3 + 0x1c) >> 0x20) - *(int *)(lVar3 + 0x18)
                       ) + 1);
  QTextOption::QTextOption((QTextOption *)(local_50 + 8),0x81);
  QPainter::drawText((QRectF *)local_50,&local_30,(QTextOption *)&pMVar2->preparedTitle);
  QTextOption::~QTextOption((QTextOption *)(local_50 + 8));
  QPainter::~QPainter((QPainter *)local_50);
  return;
}

Assistant:

void paintEvent( QPaintEvent * ) override
	{
		QPainter p( this );

		p.setPen( palette().color( QPalette::WindowText ) );

		p.drawText( rect().marginsRemoved( QMargins( d->margin, 0,
				d->margin, 0 ) ),
			d->preparedTitle, QTextOption( Qt::AlignLeft | Qt::AlignVCenter ) );
	}